

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

JsErrorCode
WScriptJsrt::InitializeImportMetaCallback(JsModuleRecord referencingModule,JsValueRef importMetaVar)

{
  JsErrorCode JVar1;
  void *local_28;
  JsValueRef specifier;
  JsPropertyIdRef urlPropId;
  
  if (importMetaVar != (JsValueRef)0x0) {
    local_28 = (JsValueRef)0x0;
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetModuleHostInfo)
              (referencingModule,JsModuleHostInfo_Url,&local_28);
    JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreatePropertyId)("url",3,&specifier);
    if (JVar1 == JsNoError) {
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)(importMetaVar,specifier,local_28,false);
    }
  }
  return JsNoError;
}

Assistant:

JsErrorCode __stdcall WScriptJsrt::InitializeImportMetaCallback(_In_opt_ JsModuleRecord referencingModule, _In_opt_ JsValueRef importMetaVar)
{
    if (importMetaVar != nullptr)
    {
        JsValueRef specifier = JS_INVALID_REFERENCE;
        ChakraRTInterface::JsGetModuleHostInfo(referencingModule, JsModuleHostInfo_Url, &specifier);

        JsPropertyIdRef urlPropId;
        if (JsNoError == CreatePropertyIdFromString("url", &urlPropId))
        {
            ChakraRTInterface::JsSetProperty(importMetaVar, urlPropId, specifier, false);
        }
    }

    return JsNoError;
}